

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::StructuralComponent::Dump(StructuralComponent *this,FILE *stream)

{
  char *pcVar1;
  char identbuf [128];
  char local_98 [136];
  
  local_98[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,stream);
  pcVar1 = UL::EncodeString(&this->DataDefinition,local_98,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","DataDefinition",pcVar1);
  if ((this->Duration).m_has_value == true) {
    pcVar1 = i64sz((this->Duration).m_property,local_98);
    fprintf((FILE *)stream,"  %22s = %s\n","Duration",pcVar1);
  }
  return;
}

Assistant:

void
StructuralComponent::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "DataDefinition", DataDefinition.EncodeString(identbuf, IdentBufferLen));
  if ( ! Duration.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "Duration", i64sz(Duration.get(), identbuf));
  }
}